

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O1

void __thiscall
Qentem::Array<Qentem::QExpression>::operator+=(Array<Qentem::QExpression> *this,QExpression *item)

{
  uint uVar1;
  
  uVar1 = this->capacity_;
  if (this->index_ == uVar1) {
    resize(this,(uVar1 == 0 | uVar1) * 2);
  }
  QExpression::QExpression(this->storage_ + this->index_,item);
  this->index_ = this->index_ + 1;
  return;
}

Assistant:

void operator+=(Type_T &&item) {
        if (Size() == Capacity()) {
            resize((Capacity() | (Capacity() == 0)) * SizeT{2});
        }

        Memory::Initialize((Storage() + Size()), Memory::Move(item));
        ++index_;
    }